

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::FillFractionals
          (double_conversion *this,uint64_t fractionals,int exponent,int fractional_count,
          Vector<char> buffer,int *length,int *decimal_point)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 in_register_0000000c;
  int *decimal_point_00;
  int *piVar5;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  int local_68;
  int digit_1;
  int i_1;
  int point_1;
  UInt128 fractionals128;
  int local_38;
  int digit;
  int i;
  int point;
  int *length_local;
  int fractional_count_local;
  int exponent_local;
  uint64_t fractionals_local;
  Vector<char> buffer_local;
  
  fractionals_local = CONCAT44(in_register_0000000c,fractional_count);
  piVar5 = buffer._8_8_;
  decimal_point_00 = (int *)buffer.start_;
  buffer_local.start_._0_4_ = (uint)buffer.start_;
  iVar2 = (int)fractionals;
  if (iVar2 < -0x80 || 0 < iVar2) {
    __assert_fail("-128 <= exponent && exponent <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                  ,0xe9,
                  "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                 );
  }
  if (-iVar2 < 0x41) {
    if ((ulong)this >> 0x38 != 0) {
      __assert_fail("fractionals >> 56 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                    ,0xef,
                    "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                   );
    }
    digit = -iVar2;
    local_38 = 0;
    for (_fractional_count_local = this;
        (local_38 < exponent && (_fractional_count_local != (double_conversion *)0x0));
        _fractional_count_local =
             (double_conversion *)
             ((long)_fractional_count_local * 5 - ((long)iVar2 << ((byte)digit & 0x3f)))) {
      digit = digit + -1;
      uVar3 = (ulong)((long)_fractional_count_local * 5) >> ((byte)digit & 0x3f);
      iVar2 = (int)uVar3;
      if (9 < iVar2) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                      ,0x100,
                      "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                     );
      }
      pcVar4 = Vector<char>::operator[]((Vector<char> *)&fractionals_local,*piVar5);
      *pcVar4 = (char)uVar3 + '0';
      *piVar5 = *piVar5 + 1;
      local_38 = local_38 + 1;
    }
    if (((ulong)_fractional_count_local >> ((char)digit - 1U & 0x3f) & 1) == 1) {
      fractionals128.low_bits_ = fractionals_local;
      buffer_00._8_8_ = piVar5;
      buffer_00.start_ = (char *)(ulong)(uint)buffer_local.start_;
      RoundUp((double_conversion *)fractionals_local,buffer_00,length,decimal_point_00);
    }
  }
  else {
    if (-iVar2 < 0x41 || 0x80 < -iVar2) {
      __assert_fail("64 < -exponent && -exponent <= 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                    ,0x10a,
                    "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                   );
    }
    UInt128::UInt128((UInt128 *)&i_1,(uint64_t)this,0);
    UInt128::Shift((UInt128 *)&i_1,-0x40 - iVar2);
    digit_1 = 0x80;
    local_68 = 0;
    while ((local_68 < exponent && (bVar1 = UInt128::IsZero((UInt128 *)&i_1), !bVar1))) {
      UInt128::Multiply((UInt128 *)&i_1,5);
      digit_1 = digit_1 + -1;
      iVar2 = UInt128::DivModPowerOf2((UInt128 *)&i_1,digit_1);
      if (9 < iVar2) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                      ,0x116,
                      "void FIX::double_conversion::FillFractionals(uint64_t, int, int, Vector<char>, int *, int *)"
                     );
      }
      pcVar4 = Vector<char>::operator[]((Vector<char> *)&fractionals_local,*piVar5);
      *pcVar4 = (char)iVar2 + '0';
      *piVar5 = *piVar5 + 1;
      local_68 = local_68 + 1;
    }
    iVar2 = UInt128::BitAt((UInt128 *)&i_1,digit_1 + -1);
    if (iVar2 == 1) {
      buffer_01._8_8_ = piVar5;
      buffer_01.start_ = (char *)(ulong)(uint)buffer_local.start_;
      RoundUp((double_conversion *)fractionals_local,buffer_01,length,decimal_point_00);
    }
  }
  return;
}

Assistant:

static void FillFractionals(uint64_t fractionals, int exponent,
                            int fractional_count, Vector<char> buffer,
                            int* length, int* decimal_point) {
  ASSERT(-128 <= exponent && exponent <= 0);
  // 'fractionals' is a fixed-point number, with binary point at bit
  // (-exponent). Inside the function the non-converted remainder of fractionals
  // is a fixed-point number, with binary point at bit 'point'.
  if (-exponent <= 64) {
    // One 64 bit number is sufficient.
    ASSERT(fractionals >> 56 == 0);
    int point = -exponent;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals == 0) break;
      // Instead of multiplying by 10 we multiply by 5 and adjust the point
      // location. This way the fractionals variable will not overflow.
      // Invariant at the beginning of the loop: fractionals < 2^point.
      // Initially we have: point <= 64 and fractionals < 2^56
      // After each iteration the point is decremented by one.
      // Note that 5^3 = 125 < 128 = 2^7.
      // Therefore three iterations of this loop will not overflow fractionals
      // (even without the subtraction at the end of the loop body). At this
      // time point will satisfy point <= 61 and therefore fractionals < 2^point
      // and any further multiplication of fractionals by 5 will not overflow.
      fractionals *= 5;
      point--;
      int digit = static_cast<int>(fractionals >> point);
      ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
      fractionals -= static_cast<uint64_t>(digit) << point;
    }
    // If the first bit after the point is set we have to round up.
    if (((fractionals >> (point - 1)) & 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  } else {  // We need 128 bits.
    ASSERT(64 < -exponent && -exponent <= 128);
    UInt128 fractionals128 = UInt128(fractionals, 0);
    fractionals128.Shift(-exponent - 64);
    int point = 128;
    for (int i = 0; i < fractional_count; ++i) {
      if (fractionals128.IsZero()) break;
      // As before: instead of multiplying by 10 we multiply by 5 and adjust the
      // point location.
      // This multiplication will not overflow for the same reasons as before.
      fractionals128.Multiply(5);
      point--;
      int digit = fractionals128.DivModPowerOf2(point);
      ASSERT(digit <= 9);
      buffer[*length] = static_cast<char>('0' + digit);
      (*length)++;
    }
    if (fractionals128.BitAt(point - 1) == 1) {
      RoundUp(buffer, length, decimal_point);
    }
  }
}